

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_ls.c
# Opt level: O0

void InitUserData(UserData data,N_Vector u)

{
  N_Vector u_local;
  UserData data_local;
  
  data->u = u;
  data->om = 7.272205216643056e-05;
  data->dx = 2.2222222222222223;
  data->dy = 2.2222222222222223;
  data->hdco = 4e-06 / (data->dx * data->dx);
  data->haco = 0.001 / (data->dx * 2.0);
  data->vdco = (1.0 / (data->dy * data->dy)) * 1e-08;
  return;
}

Assistant:

static void InitUserData(UserData data, N_Vector u)
{
  data->u    = u;
  data->om   = PI / HALFDAY;
  data->dx   = (XMAX - XMIN) / (MX - 1);
  data->dy   = (YMAX - YMIN) / (MY - 1);
  data->hdco = KH / SQR(data->dx);
  data->haco = VEL / (TWO * data->dx);
  data->vdco = (ONE / SQR(data->dy)) * KV0;
}